

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O3

int wally_set_operations(wally_operations *ops)

{
  int iVar1;
  
  iVar1 = -2;
  if ((((ops != (wally_operations *)0x0) && (ops->struct_size == 0x50)) &&
      (ops->reserved_1 == (void *)0x0)) &&
     (((ops->reserved_2 == (void *)0x0 && (ops->reserved_3 == (void *)0x0)) &&
      (ops->reserved_4 == (void *)0x0)))) {
    if (ops->malloc_fn != (wally_malloc_t)0x0) {
      _ops.malloc_fn = ops->malloc_fn;
    }
    if (ops->free_fn != (wally_free_t)0x0) {
      _ops.free_fn = ops->free_fn;
    }
    if (ops->bzero_fn != (wally_bzero_t)0x0) {
      _ops.bzero_fn = ops->bzero_fn;
    }
    if (ops->ec_nonce_fn != (wally_ec_nonce_t)0x0) {
      _ops.ec_nonce_fn = ops->ec_nonce_fn;
    }
    iVar1 = 0;
    if (ops->secp_context_fn != (secp_context_t)0x0) {
      _ops.secp_context_fn = ops->secp_context_fn;
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int wally_set_operations(const struct wally_operations *ops)
{
    if (!ops || ops->struct_size != sizeof(struct wally_operations))
        return WALLY_EINVAL; /* Null or invalid version of ops */
    /* Reserved pointers must be null so they can be enabled in the
     * future without breaking back compatibility */
    if (ops->reserved_1 || ops->reserved_2 || ops->reserved_3 || ops->reserved_4)
        return WALLY_EINVAL;

#define COPY_FN_PTR(name) if (ops->name) _ops.name = ops->name
    COPY_FN_PTR(malloc_fn);
    COPY_FN_PTR(free_fn);
    COPY_FN_PTR (bzero_fn);
    COPY_FN_PTR (ec_nonce_fn);
    COPY_FN_PTR (secp_context_fn);
#undef COPY_FN_PTR
    return WALLY_OK;
}